

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoDeleteTempFile.cpp
# Opt level: O2

void __thiscall
MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(AutoDeleteTempFile *this,FileType type)

{
  int iVar1;
  runtime_error *this_00;
  char *pcVar2;
  code *pcVar3;
  undefined *puVar4;
  allocator<char> local_21;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"/tmp/com.apple.mil.test_file_temp.XXXXXX",&local_21);
  this->m_fileDescriptor = -1;
  if (type == DIR) {
    pcVar2 = mkdtemp((this->m_filename)._M_dataplus._M_p);
    if (pcVar2 != (char *)0x0) {
      chmod((this->m_filename)._M_dataplus._M_p,0x1ed);
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to generate temporary directory");
  }
  else {
    if (type != FILE) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                ((invalid_argument *)this_00,"Invalid requested file type");
      pcVar3 = std::invalid_argument::~invalid_argument;
      puVar4 = &std::invalid_argument::typeinfo;
      goto LAB_0018a449;
    }
    iVar1 = mkstemp((this->m_filename)._M_dataplus._M_p);
    this->m_fileDescriptor = iVar1;
    if (iVar1 != -1) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unable to generate temporary filename");
  }
  pcVar3 = std::runtime_error::~runtime_error;
  puVar4 = &std::runtime_error::typeinfo;
LAB_0018a449:
  __cxa_throw(this_00,puVar4,pcVar3);
}

Assistant:

AutoDeleteTempFile::AutoDeleteTempFile(FileType type)
    : m_filename("/tmp/com.apple.mil.test_file_temp.XXXXXX")
    , m_fileDescriptor(-1)
{
    switch (type) {
        case FILE:
        {
            m_fileDescriptor = mkstemp(m_filename.data());
            if (m_fileDescriptor == -1) {
                throw std::runtime_error("unable to generate temporary filename");
            }
            break;
        }
        case DIR:
        {
            if (mkdtemp(m_filename.data()) == nullptr) {
                throw std::runtime_error("unable to generate temporary directory");
            }
            chmod(m_filename.data(), S_IRUSR | S_IWUSR | S_IXUSR | S_IRGRP | S_IXGRP | S_IROTH | S_IXOTH);
            break;
        }
        default:
            throw std::invalid_argument("Invalid requested file type");
    }
}